

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::Server::stop(Server *this)

{
  socket_t sock_00;
  socket_t sock;
  Server *this_local;
  
  if ((this->is_running_ & 1U) != 0) {
    if (this->svr_sock_ == -1) {
      __assert_fail("svr_sock_ != INVALID_SOCKET",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                    ,0x650,"void httplib::Server::stop()");
    }
    sock_00 = this->svr_sock_;
    this->svr_sock_ = -1;
    detail::shutdown_socket(sock_00);
    detail::close_socket(sock_00);
  }
  return;
}

Assistant:

inline void Server::stop()
{
    if (is_running_) {
        assert(svr_sock_ != INVALID_SOCKET);
        auto sock = svr_sock_;
        svr_sock_ = INVALID_SOCKET;
        detail::shutdown_socket(sock);
        detail::close_socket(sock);
    }
}